

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O2

void render_html_escaped(MD_HTML *r,MD_CHAR *data,MD_SIZE size)

{
  char cVar1;
  uint uVar2;
  void *pvVar3;
  uint uVar4;
  ulong uVar5;
  MD_SIZE MVar6;
  char *pcVar7;
  MD_SIZE MStack_40;
  
  uVar2 = 0;
  do {
    MVar6 = 0;
    uVar4 = uVar2;
    while( true ) {
      uVar5 = (ulong)uVar4;
      if ((((size <= uVar4 + 3) || ((r->escape_map[(byte)data[uVar5]] & 1U) != 0)) ||
          ((r->escape_map[(byte)data[uVar4 + 1]] & 1U) != 0)) ||
         (((r->escape_map[(byte)data[uVar4 + 2]] & 1U) != 0 ||
          ((r->escape_map[(byte)data[uVar4 + 3]] & 1U) != 0)))) break;
      uVar4 = uVar4 + 4;
      MVar6 = MVar6 + 4;
    }
    while ((uVar5 < size && ((r->escape_map[(byte)data[uVar5]] & 1U) == 0))) {
      uVar5 = uVar5 + 1;
      MVar6 = MVar6 + 1;
    }
    if (uVar2 < (uint)uVar5) {
      (*r->process_output)(data + uVar2,MVar6,r->userdata);
    }
    if (size <= uVar5) {
      return;
    }
    cVar1 = data[uVar5 & 0xffffffff];
    if (cVar1 == '\"') {
      pvVar3 = r->userdata;
      pcVar7 = "&quot;";
      MStack_40 = 6;
LAB_0010db20:
      (*r->process_output)(pcVar7,MStack_40,pvVar3);
    }
    else {
      if (cVar1 == '>') {
        pvVar3 = r->userdata;
        pcVar7 = "&gt;";
LAB_0010db0d:
        MStack_40 = 4;
        goto LAB_0010db20;
      }
      if (cVar1 == '<') {
        pvVar3 = r->userdata;
        pcVar7 = "&lt;";
        goto LAB_0010db0d;
      }
      if (cVar1 == '&') {
        pvVar3 = r->userdata;
        pcVar7 = "&amp;";
        MStack_40 = 5;
        goto LAB_0010db20;
      }
    }
    uVar2 = (uint)uVar5 + 1;
  } while( true );
}

Assistant:

static void
render_html_escaped(MD_HTML* r, const MD_CHAR* data, MD_SIZE size)
{
    MD_OFFSET beg = 0;
    MD_OFFSET off = 0;

    /* Some characters need to be escaped in normal HTML text. */
    #define NEED_HTML_ESC(ch)   (r->escape_map[(unsigned char)(ch)] & NEED_HTML_ESC_FLAG)

    while(1) {
        /* Optimization: Use some loop unrolling. */
        while(off + 3 < size  &&  !NEED_HTML_ESC(data[off+0])  &&  !NEED_HTML_ESC(data[off+1])
                              &&  !NEED_HTML_ESC(data[off+2])  &&  !NEED_HTML_ESC(data[off+3]))
            off += 4;
        while(off < size  &&  !NEED_HTML_ESC(data[off]))
            off++;

        if(off > beg)
            render_verbatim(r, data + beg, off - beg);

        if(off < size) {
            switch(data[off]) {
                case '&':   RENDER_VERBATIM(r, "&amp;"); break;
                case '<':   RENDER_VERBATIM(r, "&lt;"); break;
                case '>':   RENDER_VERBATIM(r, "&gt;"); break;
                case '"':   RENDER_VERBATIM(r, "&quot;"); break;
            }
            off++;
        } else {
            break;
        }
        beg = off;
    }
}